

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

void PIT_CeilingRaise(AActor *thing,FChangePosition *cpos)

{
  FChangePosition *this;
  uint uVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  double b;
  AActor *local_40;
  AActor *onmobj;
  TFlags<ActorFlag,_unsigned_int> local_30;
  TFlags<ActorFlag4,_unsigned_int> local_2c;
  double local_28;
  double oldz;
  FChangePosition *pFStack_18;
  bool isgood;
  FChangePosition *cpos_local;
  AActor *thing_local;
  
  pFStack_18 = cpos;
  cpos_local = (FChangePosition *)thing;
  oldz._7_1_ = P_AdjustFloorCeil(thing,cpos);
  local_28 = AActor::Z((AActor *)cpos_local);
  TFlags<ActorFlag4,_unsigned_int>::operator&
            (&local_2c,
             (int)cpos_local + (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_RANDOMIZE|MF4_BOSSDEATH));
  uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_2c);
  if (uVar1 == 0) {
    dVar3 = AActor::Z((AActor *)cpos_local);
    bVar2 = false;
    if (dVar3 < (double)cpos_local[0xc].sector) {
      dVar3 = AActor::Top((AActor *)cpos_local);
      bVar2 = false;
      if (cpos_local[0xc].moveamt - pFStack_18->moveamt <= dVar3) {
        TFlags<ActorFlag,_unsigned_int>::operator&
                  (&local_30,
                   (int)cpos_local + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
        uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_30);
        bVar2 = uVar1 == 0;
      }
    }
    if (bVar2) {
      AActor::SetZ((AActor *)cpos_local,(double)cpos_local[0xc].sector,true);
      dVar3 = AActor::Top((AActor *)cpos_local);
      if (cpos_local[0xc].moveamt <= dVar3 && dVar3 != cpos_local[0xc].moveamt) {
        AActor::SetZ((AActor *)cpos_local,
                     cpos_local[0xc].moveamt - *(double *)&cpos_local[0xe].crushchange,true);
      }
      P_CheckFakeFloorTriggers((AActor *)cpos_local,local_28,false);
      AActor::UpdateRenderSectorList((AActor *)cpos_local);
    }
    else {
      TFlags<ActorFlag2,_unsigned_int>::operator&
                ((TFlags<ActorFlag2,_unsigned_int> *)((long)&onmobj + 4),
                 (int)cpos_local + (MF2_RIP|MF2_NOTELEPORT|MF2_FLY));
      uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&onmobj + 4));
      bVar2 = false;
      if ((uVar1 != 0) && (bVar2 = false, (oldz._7_1_ & 1) == 0)) {
        dVar3 = AActor::Top((AActor *)cpos_local);
        bVar2 = dVar3 < cpos_local[0xc].moveamt;
      }
      if ((bVar2) && (bVar2 = P_TestMobjZ((AActor *)cpos_local,true,&local_40), !bVar2)) {
        dVar3 = AActor::Z(local_40);
        dVar4 = AActor::Z((AActor *)cpos_local);
        this = cpos_local;
        if (dVar3 <= dVar4) {
          dVar3 = cpos_local[0xc].moveamt;
          dVar4 = *(double *)&cpos_local[0xe].crushchange;
          b = AActor::Top(local_40);
          dVar3 = MIN<double>(dVar3 - dVar4,b);
          AActor::SetZ((AActor *)this,dVar3,true);
          AActor::UpdateRenderSectorList((AActor *)cpos_local);
        }
      }
    }
    if ((cpos_local[0x15].moveamt != 0.0) &&
       (*(FChangePosition **)cpos_local[0x15].moveamt == cpos_local)) {
      dVar3 = AActor::Z((AActor *)cpos_local);
      *(double *)((long)cpos_local[0x15].moveamt + 0x60) =
           (dVar3 - local_28) + *(double *)((long)cpos_local[0x15].moveamt + 0x60);
    }
  }
  return;
}

Assistant:

void PIT_CeilingRaise(AActor *thing, FChangePosition *cpos)
{
	bool isgood = P_AdjustFloorCeil(thing, cpos);
	double oldz = thing->Z();

	if (thing->flags4 & MF4_ACTLIKEBRIDGE) return; // do not move bridge things

	// For DOOM compatibility, only move things that are inside the floor.
	// (or something else?) Things marked as hanging from the ceiling will
	// stay where they are.
	if (thing->Z() < thing->floorz &&
		thing->Top() >= thing->ceilingz - cpos->moveamt &&
		!(thing->flags & MF_NOLIFTDROP))
	{
		thing->SetZ(thing->floorz);
		if (thing->Top() > thing->ceilingz)
		{
			thing->SetZ(thing->ceilingz - thing->Height);
		}
		P_CheckFakeFloorTriggers(thing, oldz);
		thing->UpdateRenderSectorList();
	}
	else if ((thing->flags2 & MF2_PASSMOBJ) && !isgood && thing->Top() < thing->ceilingz)
	{
		AActor *onmobj;
		if (!P_TestMobjZ(thing, true, &onmobj) && onmobj->Z() <= thing->Z())
		{
			thing->SetZ(MIN(thing->ceilingz - thing->Height, onmobj->Top()));
			thing->UpdateRenderSectorList();
		}
	}
	if (thing->player && thing->player->mo == thing)
	{
		thing->player->viewz += thing->Z() - oldz;
	}
}